

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O0

uint SOIL_load_OGL_single_cubemap
               (char *filename,char *face_order,int force_channels,uint reuse_texture_ID,uint flags)

{
  int iVar1;
  uint uVar2;
  int local_48;
  uint tex_id;
  int i;
  int channels;
  int height;
  int width;
  uchar *img;
  uint local_28;
  uint flags_local;
  uint reuse_texture_ID_local;
  int force_channels_local;
  char *face_order_local;
  char *filename_local;
  
  if (filename == (char *)0x0) {
    result_string_pointer = "Invalid single cube map file name";
    filename_local._4_4_ = 0;
  }
  else {
    img._4_4_ = flags;
    local_28 = reuse_texture_ID;
    flags_local = force_channels;
    _reuse_texture_ID_local = face_order;
    face_order_local = filename;
    if (((flags & 0x40) == 0) ||
       (filename_local._4_4_ = SOIL_direct_load_DDS(filename,reuse_texture_ID,flags,1),
       filename_local._4_4_ == 0)) {
      for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
        if (((((_reuse_texture_ID_local[local_48] != 'N') &&
              (_reuse_texture_ID_local[local_48] != 'S')) &&
             (_reuse_texture_ID_local[local_48] != 'W')) &&
            ((_reuse_texture_ID_local[local_48] != 'E' && (_reuse_texture_ID_local[local_48] != 'U')
             ))) && (_reuse_texture_ID_local[local_48] != 'D')) {
          result_string_pointer = "Invalid single cube map face order";
          return 0;
        }
      }
      iVar1 = query_cubemap_capability();
      if (iVar1 == 1) {
        _height = SOIL_load_image(face_order_local,&channels,&i,(int *)&tex_id,flags_local);
        if ((0 < (int)flags_local) && ((int)flags_local < 5)) {
          tex_id = flags_local;
        }
        if (_height == (uchar *)0x0) {
          result_string_pointer = stbi_failure_reason();
          filename_local._4_4_ = 0;
        }
        else if ((channels == i * 6) || (channels * 6 == i)) {
          uVar2 = SOIL_create_OGL_single_cubemap
                            (_height,channels,i,tex_id,_reuse_texture_ID_local,local_28,img._4_4_);
          SOIL_free_image_data(_height);
          filename_local._4_4_ = uVar2;
        }
        else {
          SOIL_free_image_data(_height);
          result_string_pointer = "Single cubemap image must have a 6:1 ratio";
          filename_local._4_4_ = 0;
        }
      }
      else {
        result_string_pointer = "No cube map capability present";
        filename_local._4_4_ = 0;
      }
    }
  }
  return filename_local._4_4_;
}

Assistant:

unsigned int
	SOIL_load_OGL_single_cubemap
	(
		const char *filename,
		const char face_order[6],
		int force_channels,
		unsigned int reuse_texture_ID,
		unsigned int flags
	)
{
	/*	variables	*/
	unsigned char* img;
	int width, height, channels, i;
	unsigned int tex_id = 0;
	/*	error checking	*/
	if( filename == NULL )
	{
		result_string_pointer = "Invalid single cube map file name";
		return 0;
	}
	/*	does the user want direct uploading of the image as a DDS file?	*/
	if( flags & SOIL_FLAG_DDS_LOAD_DIRECT )
	{
		/*	1st try direct loading of the image as a DDS file
			note: direct uploading will only load what is in the
			DDS file, no MIPmaps will be generated, the image will
			not be flipped, etc.	*/
		tex_id = SOIL_direct_load_DDS( filename, reuse_texture_ID, flags, 1 );
		if( tex_id )
		{
			/*	hey, it worked!!	*/
			return tex_id;
		}
	}
	/*	face order checking	*/
	for( i = 0; i < 6; ++i )
	{
		if( (face_order[i] != 'N') &&
			(face_order[i] != 'S') &&
			(face_order[i] != 'W') &&
			(face_order[i] != 'E') &&
			(face_order[i] != 'U') &&
			(face_order[i] != 'D') )
		{
			result_string_pointer = "Invalid single cube map face order";
			return 0;
		};
	}
	/*	capability checking	*/
	if( query_cubemap_capability() != SOIL_CAPABILITY_PRESENT )
	{
		result_string_pointer = "No cube map capability present";
		return 0;
	}
	/*	1st off, try to load the full image	*/
	img = SOIL_load_image( filename, &width, &height, &channels, force_channels );
	/*	channels holds the original number of channels, which may have been forced	*/
	if( (force_channels >= 1) && (force_channels <= 4) )
	{
		channels = force_channels;
	}
	if( NULL == img )
	{
		/*	image loading failed	*/
		result_string_pointer = stbi_failure_reason();
		return 0;
	}
	/*	now, does this image have the right dimensions?	*/
	if( (width != 6*height) &&
		(6*width != height) )
	{
		SOIL_free_image_data( img );
		result_string_pointer = "Single cubemap image must have a 6:1 ratio";
		return 0;
	}
	/*	try the image split and create	*/
	tex_id = SOIL_create_OGL_single_cubemap(
			img, width, height, channels,
			face_order, reuse_texture_ID, flags
			);
	/*	nuke the temporary image data and return the texture handle	*/
	SOIL_free_image_data( img );
	return tex_id;
}